

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

void upb_MtDecoder_PushItem(upb_MtDecoder *d,upb_LayoutItem item)

{
  upb_LayoutItem *puVar1;
  upb_LayoutItem *puVar2;
  size_t sVar3;
  undefined8 uVar4;
  ulong uVar5;
  
  uVar4 = item._0_8_;
  sVar3 = (d->vec).size;
  if (sVar3 == (d->vec).capacity) {
    uVar5 = 8;
    if (8 < sVar3 * 2) {
      uVar5 = sVar3 * 2;
    }
    puVar2 = (upb_LayoutItem *)realloc((d->vec).data,uVar5 * 0xc);
    (d->vec).data = puVar2;
    upb_MdDecoder_CheckOutOfMemory(&d->base,puVar2);
    (d->vec).capacity = uVar5;
    sVar3 = (d->vec).size;
  }
  puVar1 = (d->vec).data;
  (d->vec).size = sVar3 + 1;
  puVar2 = puVar1 + sVar3;
  puVar2->field_index = (short)uVar4;
  puVar2->offset = (short)((ulong)uVar4 >> 0x10);
  puVar2->rep = (int)((ulong)uVar4 >> 0x20);
  puVar1[sVar3].type = item.type;
  return;
}

Assistant:

static void upb_MtDecoder_PushItem(upb_MtDecoder* d, upb_LayoutItem item) {
  if (d->vec.size == d->vec.capacity) {
    size_t new_cap = UPB_MAX(8, d->vec.size * 2);
    d->vec.data = realloc(d->vec.data, new_cap * sizeof(*d->vec.data));
    upb_MdDecoder_CheckOutOfMemory(&d->base, d->vec.data);
    d->vec.capacity = new_cap;
  }
  d->vec.data[d->vec.size++] = item;
}